

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  size_t *psVar1;
  int64_t *piVar2;
  byte bVar3;
  uint32_t uVar4;
  _7zip *zip;
  unsigned_long uVar5;
  lzma_ret lVar6;
  Bool BVar7;
  uchar *puVar8;
  void *pvVar9;
  Bytef *__src;
  ssize_t sVar10;
  size_t sVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  byte *pbVar18;
  size_t sVar19;
  char *pcVar20;
  byte *pbVar21;
  byte *pbVar22;
  byte *pbVar23;
  uint uVar24;
  uint uVar25;
  byte *pbVar26;
  byte *pbVar27;
  ulong in_R11;
  ulong uVar28;
  byte *pbVar29;
  long lVar30;
  byte *pbVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  ssize_t bytes_avail;
  ZSTD_inBuffer input;
  uint local_11c;
  uint64_t local_108;
  byte *local_f8;
  byte *local_f0;
  byte *local_e8;
  byte *local_e0;
  archive_read *local_d8;
  byte *local_d0;
  byte *local_c8;
  undefined4 local_bc;
  bz_stream *local_b8;
  CPpmd7z_RangeDec *local_b0;
  lzma_stream *local_a8;
  code *local_a0;
  IByteIn *local_98;
  uchar *local_90;
  size_t local_88;
  z_streamp local_80;
  CPpmd7 *local_78;
  code *local_70;
  size_t local_68;
  ZSTD_outBuffer local_60;
  ZSTD_inBuffer local_48;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar9 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_f8);
    if (0 < (long)local_f8 && pvVar9 != (void *)0x0) {
      if ((byte *)zip->pack_stream_inbytes_remaining < local_f8) {
        local_f8 = (byte *)zip->pack_stream_inbytes_remaining;
      }
      zip->pack_stream_inbytes_remaining = zip->pack_stream_inbytes_remaining - (long)local_f8;
      if ((byte *)zip->folder_outbytes_remaining < local_f8) {
        local_f8 = (byte *)zip->folder_outbytes_remaining;
      }
      zip->folder_outbytes_remaining = zip->folder_outbytes_remaining - (long)local_f8;
      zip->uncompressed_buffer_bytes_remaining = (size_t)local_f8;
      return 0;
    }
    pcVar20 = "Truncated 7-Zip file body";
    iVar16 = 0x54;
    goto LAB_001916f8;
  }
  puVar8 = zip->uncompressed_buffer;
  local_88 = minimum;
  if (puVar8 == (uchar *)0x0) {
    sVar19 = 0x10000;
    if (0x10000 < minimum) {
      sVar19 = minimum + 0x3ff & 0xfffffffffffffc00;
    }
    zip->uncompressed_buffer_size = sVar19;
    puVar8 = (uchar *)malloc(sVar19);
    zip->uncompressed_buffer = puVar8;
    if (puVar8 == (uchar *)0x0) {
      pcVar20 = "No memory for 7-Zip decompression";
      iVar16 = 0xc;
      goto LAB_001916f8;
    }
LAB_001906b5:
    zip->uncompressed_buffer_bytes_remaining = 0;
  }
  else {
    if ((minimum <= zip->uncompressed_buffer_size) &&
       (minimum <= zip->uncompressed_buffer_bytes_remaining)) goto LAB_001906b5;
    lVar30 = (long)zip->uncompressed_buffer_pointer - (long)puVar8;
    if (zip->uncompressed_buffer_pointer == (uchar *)0x0) {
      lVar30 = 0;
    }
    if (zip->uncompressed_buffer_size < minimum) {
      uVar28 = minimum + 0x3ff & 0xfffffffffffffc00;
      puVar8 = (uchar *)realloc(puVar8,uVar28);
      if (puVar8 == (uchar *)0x0) {
        archive_set_error(&a->archive,0xc,"No memory for 7-Zip decompression");
        return -0x1e;
      }
      zip->uncompressed_buffer = puVar8;
      zip->uncompressed_buffer_size = uVar28;
    }
    if (lVar30 != 0) {
      memmove(zip->uncompressed_buffer,zip->uncompressed_buffer + lVar30,
              zip->uncompressed_buffer_bytes_remaining);
    }
  }
  zip->uncompressed_buffer_pointer = (uchar *)0x0;
  local_98 = &zip->bytein;
  local_b0 = &zip->range_dec;
  local_a0 = Ppmd7z_RangeDec_Init;
  local_70 = Ppmd7_DecodeSymbol;
  local_78 = &zip->ppmd7_context;
  local_80 = &zip->stream;
  local_b8 = &zip->bzstream;
  local_a8 = &zip->lzstream;
  local_90 = zip->odd_bcj;
  local_d8 = a;
  do {
    __src = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_f8);
    if ((long)local_f8 < 1) {
      iVar16 = 0x54;
      pcVar20 = "Truncated 7-Zip file body";
LAB_0019088a:
      archive_set_error(&a->archive,iVar16,pcVar20);
      iVar16 = 1;
    }
    else {
      local_c8 = zip->uncompressed_buffer;
      local_68 = zip->uncompressed_buffer_size;
      local_d0 = (byte *)zip->uncompressed_buffer_bytes_remaining;
      pbVar21 = (byte *)(local_68 - (long)local_d0);
      local_e8 = (byte *)zip->pack_stream_inbytes_remaining;
      pbVar31 = local_f8;
      if (local_e8 <= local_f8) {
        pbVar31 = local_e8;
      }
      pbVar14 = local_c8 + (long)local_d0;
      local_11c = 0;
      pbVar13 = pbVar21;
      pbVar27 = pbVar31;
      local_f0 = pbVar21;
      local_e0 = pbVar14;
      if ((zip->codec == 0x21) || (zip->codec2 != 0x3030103)) {
LAB_001909a4:
        pbVar29 = local_f0;
        pbVar18 = local_e0;
        if (zip->codec2 == 0x303011b) {
          sVar11 = zip->tmp_stream_bytes_remaining;
          if (sVar11 != 0) {
            sVar10 = Bcj2_Decode(zip,local_e0,(size_t)local_f0);
            a = local_d8;
            if (sVar10 < 0) {
              bVar32 = false;
              archive_set_error(&local_d8->archive,-1,"BCJ2 conversion Failed");
              in_R11 = 0xffffffe7;
            }
            else {
              zip->main_stream_bytes_remaining =
                   zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar11);
              pbVar29 = pbVar29 + -sVar10;
              if ((local_e8 == (byte *)0x0) || (pbVar29 == (byte *)0x0)) {
                pbVar13 = pbVar21 + -(long)pbVar29;
                if ((local_e8 == (byte *)0x0) && (zip->tmp_stream_bytes_remaining != 0)) {
                  local_11c = 1;
                }
                bVar32 = false;
                in_R11 = (ulong)local_11c;
                pbVar27 = (byte *)0x0;
              }
              else {
                in_R11 = in_R11 & 0xffffffff;
                local_e0 = local_e0 + sVar10;
                bVar32 = true;
                local_f0 = pbVar29;
              }
            }
            if (!bVar32) goto LAB_00190ff8;
          }
          pbVar18 = zip->tmp_stream_buff;
          pbVar29 = (byte *)zip->tmp_stream_buff_size;
        }
        uVar5 = zip->codec;
        if ((long)uVar5 < 0x30401) {
          if (uVar5 == 0) {
            pbVar13 = pbVar29;
            if (pbVar31 < pbVar29) {
              pbVar13 = pbVar31;
            }
            memcpy(pbVar18,__src,(size_t)pbVar13);
            pbVar12 = pbVar31 + -(long)pbVar13;
            pbVar29 = pbVar29 + -(long)pbVar13;
            if (local_e8 == (byte *)0x0) {
              local_11c = 1;
            }
          }
          else {
            if ((uVar5 != 0x21) && (uVar5 != 0x30101)) goto LAB_00190d2e;
            (zip->lzstream).next_in = __src;
            (zip->lzstream).avail_in = (size_t)pbVar31;
            (zip->lzstream).next_out = pbVar18;
            (zip->lzstream).avail_out = (size_t)pbVar29;
            lVar6 = lzma_code(local_a8,LZMA_RUN);
            if (lVar6 != LZMA_OK) {
              if (lVar6 != LZMA_STREAM_END) {
                pcVar20 = "Decompression failed(%d)";
LAB_00190eda:
                archive_set_error(&a->archive,-1,pcVar20,(ulong)lVar6);
                goto LAB_00190ee3;
              }
              lzma_end(local_a8);
              zip->lzstream_valid = 0;
              local_11c = 1;
            }
            pbVar12 = (byte *)(zip->lzstream).avail_in;
            pbVar29 = (byte *)(zip->lzstream).avail_out;
          }
        }
        else if ((long)uVar5 < 0x40202) {
          if (uVar5 != 0x30401) {
            if (uVar5 != 0x40108) {
LAB_00190d2e:
              pcVar20 = "Decompression internal error";
              goto LAB_00190ebf;
            }
            (zip->stream).next_in = __src;
            (zip->stream).avail_in = (uInt)pbVar31;
            (zip->stream).next_out = pbVar18;
            (zip->stream).avail_out = (uInt)pbVar29;
            lVar6 = cm_zlib_inflate(local_80,0);
            if (lVar6 != LZMA_OK) {
              if (lVar6 != LZMA_STREAM_END) {
                pcVar20 = "File decompression failed (%d)";
                goto LAB_00190eda;
              }
              local_11c = 1;
            }
            pbVar12 = (byte *)(ulong)(zip->stream).avail_in;
            pbVar29 = (byte *)(ulong)(zip->stream).avail_out;
            goto LAB_00190f1f;
          }
          pbVar12 = pbVar31;
          if (((zip->ppmd7_valid == 0) || (iVar16 = zip->ppmd7_stat, iVar16 < 0)) ||
             (pbVar29 == (byte *)0x0)) {
            archive_set_error(&a->archive,-1,"Decompression internal error");
LAB_00190e43:
            bVar32 = false;
            in_R11 = 0xffffffe7;
          }
          else {
            (zip->ppstream).next_in = __src;
            (zip->ppstream).avail_in = (int64_t)pbVar31;
            (zip->ppstream).stream_in = 0;
            (zip->ppstream).next_out = pbVar18;
            (zip->ppstream).avail_out = (int64_t)pbVar29;
            if (iVar16 == 0) {
              (zip->bytein).a = a;
              (zip->bytein).Read = ppmd_read;
              (zip->range_dec).Stream = local_98;
              BVar7 = (*local_a0)(local_b0);
              if (BVar7 == 0) {
                zip->ppmd7_stat = -1;
                archive_set_error(&a->archive,-1,"Failed to initialize PPMd range decoder");
              }
              else {
                if ((zip->ppstream).overconsumed == 0) {
                  zip->ppmd7_stat = 1;
                  in_R11 = in_R11 & 0xffffffff;
                  goto LAB_00190d98;
                }
                zip->ppmd7_stat = -1;
              }
              goto LAB_00190e43;
            }
LAB_00190d98:
            if (local_e8 == (byte *)0x0) {
              local_108 = zip->folder_outbytes_remaining;
            }
            else {
              local_108 = 0;
            }
            do {
              in_R11 = in_R11 & 0xffffffff;
              iVar16 = (*local_70)(local_78,&local_b0->p);
              if (iVar16 < 0) {
                zip->ppmd7_stat = -1;
                bVar32 = false;
                archive_set_error(&a->archive,0x54,"Failed to decode PPMd");
                in_R11 = 0xffffffe7;
              }
              else if ((zip->ppstream).overconsumed == 0) {
                puVar8 = (zip->ppstream).next_out;
                (zip->ppstream).next_out = puVar8 + 1;
                *puVar8 = (uchar)iVar16;
                piVar2 = &(zip->ppstream).avail_out;
                *piVar2 = *piVar2 + -1;
                piVar2 = &(zip->ppstream).total_out;
                *piVar2 = *piVar2 + 1;
                bVar32 = local_108 == 0;
                local_108 = local_108 - 1;
                if (bVar32) {
                  local_108 = 0;
                }
                bVar32 = true;
              }
              else {
                zip->ppmd7_stat = -1;
                in_R11 = 0xffffffe7;
                bVar32 = false;
              }
              if (!bVar32) {
                bVar32 = false;
                goto LAB_00190e48;
              }
              pbVar18 = (byte *)(zip->ppstream).avail_out;
            } while ((pbVar18 != (byte *)0x0) && ((zip->ppstream).avail_in != 0 || local_108 != 0));
            bVar32 = true;
            pbVar12 = (byte *)(zip->ppstream).avail_in;
            pbVar29 = pbVar18;
          }
LAB_00190e48:
          if (!bVar32) goto LAB_00190ff8;
        }
        else {
          if (uVar5 != 0x40202) {
            if (uVar5 != 0x4f71101) goto LAB_00190d2e;
            local_48.pos = 0;
            local_60.pos = 0;
            local_bc = (int)in_R11;
            local_60.dst = pbVar18;
            local_60.size = (size_t)pbVar29;
            local_48.src = __src;
            local_48.size = (size_t)pbVar31;
            sVar11 = ZSTD_decompressStream(zip->zstd_dstream,&local_60,&local_48);
            uVar25 = ZSTD_isError(sVar11);
            if (uVar25 == 0) {
              pbVar12 = pbVar31 + -local_48.pos;
              pbVar29 = pbVar29 + -local_60.pos;
              goto LAB_00190f1f;
            }
            pcVar20 = ZSTD_getErrorName(sVar11);
            archive_set_error(&a->archive,-1,"Zstd decompression failed: %s",pcVar20);
            in_R11 = 0xffffffe7;
            goto LAB_00190ff8;
          }
          (zip->bzstream).next_in = (char *)__src;
          (zip->bzstream).avail_in = (uInt)pbVar31;
          (zip->bzstream).next_out = (char *)pbVar18;
          (zip->bzstream).avail_out = (uInt)pbVar29;
          iVar16 = BZ2_bzDecompress(local_b8);
          if (iVar16 != 0) {
            if (iVar16 == 4) {
              iVar16 = BZ2_bzDecompressEnd(local_b8);
              if (iVar16 == 0) {
                zip->bzstream_valid = 0;
                local_11c = 1;
                goto LAB_00190f0a;
              }
              pcVar20 = "Failed to clean up decompressor";
            }
            else {
              pcVar20 = "bzip decompression failed";
            }
LAB_00190ebf:
            archive_set_error(&a->archive,-1,pcVar20);
LAB_00190ee3:
            in_R11 = 0xffffffe7;
            goto LAB_00190ff8;
          }
LAB_00190f0a:
          pbVar12 = (byte *)(ulong)(zip->bzstream).avail_in;
          pbVar29 = (byte *)(ulong)(zip->bzstream).avail_out;
        }
LAB_00190f1f:
        pbVar27 = pbVar21 + -(long)pbVar29;
        pbVar13 = pbVar27;
        if (zip->codec != 0x21) {
          uVar5 = zip->codec2;
          if (uVar5 == 10) {
            if (pbVar27 < (byte *)0x4) {
              pbVar13 = (byte *)0x0;
            }
            else {
              pbVar18 = local_c8 + (long)local_d0;
              pbVar14 = (byte *)0x0;
              do {
                bVar15 = pbVar18[(long)pbVar14];
                uVar25 = (uint)(pbVar18 + 2)[(long)pbVar14] << 0x10 |
                         (uint)(pbVar18 + 1)[(long)pbVar14] << 8;
                uVar24 = uVar25 | bVar15;
                bVar3 = (pbVar18 + 3)[(long)pbVar14];
                if ((bVar3 & 0xfc) == 0x94) {
                  iVar16 = (uVar24 | (uint)bVar3 << 0x18) - (zip->bcj_ip + (int)pbVar14 >> 2);
                  pbVar18[(long)pbVar14] = (byte)iVar16;
                  (pbVar18 + 1)[(long)pbVar14] = (byte)((uint)iVar16 >> 8);
                  (pbVar18 + 2)[(long)pbVar14] = (byte)((uint)iVar16 >> 0x10);
                  bVar15 = (byte)((uint)iVar16 >> 0x18) & 3 | 0x94;
LAB_001911fe:
                  (pbVar18 + 3)[(long)pbVar14] = bVar15;
                }
                else if (((bVar3 & 0x9f) == 0x90) && (((uVar24 >> 3) + 0x20000 & 0x1c0000) == 0)) {
                  uVar24 = (bVar3 >> 5 & 3 | (uVar25 | bVar15 & 0xffffffe0) >> 3) -
                           (zip->bcj_ip + (int)pbVar14 >> 0xc);
                  uVar25 = uVar24 * 8 & 0x1fffe0;
                  pbVar18[(long)pbVar14] = bVar15 & 0x1f | (byte)uVar25;
                  (pbVar18 + 1)[(long)pbVar14] = (byte)(uVar24 >> 5);
                  (pbVar18 + 2)[(long)pbVar14] =
                       (byte)(-(uVar24 & 0x20000) >> 0x10) & 0xe0 | (byte)(uVar25 >> 0x10);
                  bVar15 = (char)uVar24 << 5 | 0x90;
                  goto LAB_001911fe;
                }
                pbVar13 = pbVar14 + 4;
                pbVar26 = pbVar14 + 8;
                pbVar14 = pbVar13;
              } while (pbVar26 <= pbVar27);
            }
            zip->bcj_ip = zip->bcj_ip + (int)pbVar13;
          }
          else if (uVar5 == 0x3030501) {
            if (pbVar27 < (byte *)0x4) {
              pbVar13 = (byte *)0x0;
            }
            else {
              pbVar13 = (byte *)0x4;
              lVar30 = 0;
              do {
                if ((pbVar14 + -1)[(long)pbVar13] == 0xeb) {
                  uVar25 = ((((uint)(pbVar14 + -3)[(long)pbVar13] << 10 |
                             (uint)(pbVar14 + -2)[(long)pbVar13] << 0x12) +
                            (uint)(pbVar14 + -4)[(long)pbVar13] * 4) - zip->bcj_ip) + (int)lVar30;
                  (pbVar14 + -4)[(long)pbVar13] = (byte)(uVar25 >> 2);
                  (pbVar14 + -3)[(long)pbVar13] = (byte)(uVar25 >> 10);
                  (pbVar14 + -2)[(long)pbVar13] = (byte)(uVar25 >> 0x12);
                }
                pbVar13 = pbVar13 + 4;
                lVar30 = lVar30 + -4;
              } while (pbVar13 <= pbVar27);
              pbVar13 = (byte *)-lVar30;
            }
            zip->bcj_ip = zip->bcj_ip + (int)pbVar13;
          }
          else if (uVar5 == 0x3030103) {
            if (pbVar27 < (byte *)0x5) {
              pbVar13 = (byte *)0x0;
            }
            else {
              pbVar18 = (byte *)zip->bcj_prevPosT;
              uVar28 = (ulong)zip->bcj_prevMask;
              uVar4 = zip->bcj_ip;
              pbVar26 = pbVar14 + (long)pbVar27 + -4;
              local_d0 = pbVar29 + (long)(local_d0 + (5 - local_68));
              pbVar13 = (byte *)0x0;
              do {
                pbVar23 = pbVar14 + (long)pbVar13;
                bVar32 = pbVar23 < pbVar26;
                if ((bVar32) && (bVar32 = true, (*pbVar23 & 0xfe) != 0xe8)) {
                  pbVar13 = pbVar13 + (long)local_d0;
                  pbVar22 = pbVar23;
                  do {
                    pbVar23 = pbVar26;
                    if (pbVar13 == (byte *)0x0) break;
                    pbVar23 = pbVar22 + 1;
                    pbVar13 = pbVar13 + 1;
                    pbVar22 = pbVar23;
                  } while ((*pbVar23 & 0xfe) != 0xe8);
                  bVar32 = pbVar23 < pbVar26;
                }
                pbVar13 = pbVar23 + -(long)pbVar14;
                if (bVar32) {
                  pbVar18 = pbVar13 + -(long)pbVar18;
                  if (pbVar18 < (byte *)0x4) {
                    uVar24 = (int)uVar28 << ((char)pbVar18 - 1U & 0x1f);
                    uVar25 = uVar24 & 7;
                    if (uVar25 == 0) goto LAB_001913a9;
                    bVar33 = (0xe8U >> uVar25 & 1) != 0;
                    bVar34 = (byte)(pbVar23[4 - (ulong)(byte)(&x86_Convert_kMaskToBitNumber)[uVar25]
                                           ] + 1) < 2;
                    if (bVar34 || bVar33) {
                      pbVar18 = pbVar13;
                      uVar25 = (uVar24 & 3) * 2 + 1;
                    }
                    pbVar13 = pbVar13 + (bVar34 || bVar33);
                    uVar28 = (ulong)uVar25;
                    if (bVar34 || bVar33) goto LAB_00191468;
                  }
                  else {
LAB_001913a9:
                    uVar28 = 0;
                  }
                  pbVar18 = pbVar13;
                  bVar15 = pbVar23[4];
                  if ((bVar15 == 0xff) || (bVar15 == 0)) {
                    uVar25 = (uint)pbVar23[1] |
                             (uint)pbVar23[2] << 8 | (uint)pbVar23[3] << 0x10 | (uint)bVar15 << 0x18
                    ;
                    do {
                      uVar24 = uVar25 - (uVar4 + (int)pbVar18);
                      if ((uint)uVar28 == 0) {
LAB_0019142b:
                        bVar33 = false;
                      }
                      else {
                        uVar17 = uVar24 >> ((&x86_Convert_kMaskToBitNumber)[uVar28] * -8 + 0x18U &
                                           0x1f);
                        if (((char)uVar17 != -1) && ((uVar17 & 0xff) != 0)) goto LAB_0019142b;
                        uVar25 = ~(-1 << ((&x86_Convert_kMaskToBitNumber)[uVar28] * -8 & 0x1fU) ^
                                  uVar24);
                        bVar33 = true;
                      }
                    } while (bVar33);
                    pbVar23[4] = (byte)((int)(uVar24 * 0x80) >> 0x1f);
                    pbVar23[3] = (byte)(uVar24 >> 0x10);
                    pbVar23[2] = (byte)(uVar24 >> 8);
                    pbVar23[1] = (byte)uVar24;
                    pbVar13 = pbVar18 + 5;
                    a = local_d8;
                  }
                  else {
                    uVar28 = (ulong)(((uint)uVar28 & 3) * 2 + 1);
                    pbVar13 = pbVar18 + 1;
                  }
                }
LAB_00191468:
              } while (bVar32);
              zip->bcj_prevPosT = (size_t)pbVar18;
              zip->bcj_prevMask = (uint32_t)uVar28;
              zip->bcj_ip = zip->bcj_ip + (int)pbVar13;
              local_c8 = pbVar12;
            }
            sVar19 = (long)pbVar27 - (long)pbVar13;
            zip->odd_bcj_size = sVar19;
            if ((((sVar19 == 0) || (local_11c != 0)) || (4 < sVar19)) || (local_e8 == (byte *)0x0))
            {
              zip->odd_bcj_size = 0;
              pbVar13 = pbVar27;
            }
            else {
              memcpy(local_90,pbVar14 + (long)pbVar13,sVar19);
              a = local_d8;
            }
          }
        }
        pbVar27 = pbVar31 + -(long)pbVar12;
        if (zip->codec2 == 0x303011b) {
          uVar28 = zip->tmp_stream_buff_size - (long)pbVar29;
          if (zip->main_stream_bytes_remaining <= uVar28) {
            uVar28 = zip->main_stream_bytes_remaining;
          }
          zip->tmp_stream_bytes_avail = uVar28;
          zip->tmp_stream_bytes_remaining = uVar28;
          sVar10 = Bcj2_Decode(zip,local_e0,(size_t)local_f0);
          if (sVar10 < 0) {
            archive_set_error(&a->archive,-1,"BCJ2 conversion Failed");
            in_R11 = 0xffffffe7;
            goto LAB_00190ff8;
          }
          zip->main_stream_bytes_remaining =
               zip->main_stream_bytes_remaining +
               (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
          pbVar13 = pbVar21 + (sVar10 - (long)local_f0);
        }
        in_R11 = (ulong)local_11c;
      }
      else {
        if ((pbVar21 < (byte *)0x5 && local_e8 != (byte *)0x0) && (zip->odd_bcj_size != 0)) {
          local_11c = 0;
          bVar32 = false;
          in_R11 = 0;
          pbVar13 = (byte *)0x0;
          pbVar27 = (byte *)0x0;
        }
        else {
          if (pbVar21 != (byte *)0x0 && zip->odd_bcj_size != 0) {
            pbVar29 = (byte *)0x0;
            do {
              pbVar14[(long)pbVar29] = zip->odd_bcj[(long)pbVar29];
              pbVar18 = pbVar29 + 1;
              psVar1 = &zip->odd_bcj_size;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) break;
              bVar32 = pbVar21 + -1 != pbVar29;
              pbVar29 = pbVar18;
            } while (bVar32);
            local_e0 = pbVar14 + (long)pbVar18;
            local_f0 = pbVar21 + -(long)pbVar18;
          }
          if ((local_e8 == (byte *)0x0) || (local_f0 == (byte *)0x0)) {
            in_R11 = (ulong)(local_e8 == (byte *)0x0);
            pbVar13 = pbVar21 + -(long)local_f0;
            pbVar27 = (byte *)0x0;
            bVar32 = false;
            local_11c = (uint)(local_e8 == (byte *)0x0);
          }
          else {
            local_11c = 0;
            bVar32 = true;
          }
        }
        if (bVar32) goto LAB_001909a4;
      }
LAB_00190ff8:
      iVar16 = 1;
      if ((uint)in_R11 < 2) {
        pbVar31 = (byte *)zip->pack_stream_inbytes_remaining;
        zip->pack_stream_inbytes_remaining = (long)pbVar31 - (long)pbVar27;
        pbVar21 = (byte *)zip->folder_outbytes_remaining;
        pbVar14 = pbVar21;
        if (pbVar13 < pbVar21) {
          pbVar14 = pbVar13;
        }
        zip->folder_outbytes_remaining = (long)pbVar21 - (long)pbVar14;
        pbVar29 = pbVar14 + zip->uncompressed_buffer_bytes_remaining;
        zip->uncompressed_buffer_bytes_remaining = (size_t)pbVar29;
        zip->pack_stream_bytes_unconsumed = (size_t)pbVar27;
        iVar16 = 2;
        if ((pbVar29 != (byte *)zip->uncompressed_buffer_size) &&
           ((((zip->codec2 != 0x3030103 || (pbVar29 + 5 <= (byte *)zip->uncompressed_buffer_size))
             || (zip->odd_bcj_size == 0)) && ((pbVar31 != pbVar27 || (pbVar13 < pbVar21)))))) {
          if (((uint)in_R11 != 0) || (pbVar14 == (byte *)0x0 && pbVar27 == (byte *)0x0)) {
            iVar16 = -1;
            pcVar20 = "Damaged 7-Zip archive";
            goto LAB_0019088a;
          }
          read_consume(a);
          iVar16 = 0;
        }
      }
    }
  } while (iVar16 == 0);
  if (iVar16 != 2) {
    return -0x1e;
  }
  if (local_88 <= zip->uncompressed_buffer_bytes_remaining) {
    zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
    return 0;
  }
  pcVar20 = "Damaged 7-Zip archive";
  iVar16 = -1;
LAB_001916f8:
  archive_set_error(&a->archive,iVar16,pcVar20);
  return -0x1e;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if ((uint64_t)bytes_avail > zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if ((uint64_t)bytes_avail > zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}